

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O2

bool duckdb::ArrayToArrayCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  unsigned_long *puVar1;
  undefined1 uVar2;
  string *msg_00;
  string *params;
  BoundCastData *pBVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  unsigned_long in_R8;
  allocator local_81;
  string msg;
  Exception local_50 [2];
  
  msg_00 = (string *)ArrayType::GetSize(&source->type);
  params = (string *)ArrayType::GetSize(&result->type);
  if (msg_00 != params) {
    ::std::__cxx11::string::string
              ((string *)local_50,"Cannot cast array of size %u to array of size %u",&local_81);
    Exception::ConstructMessage<unsigned_long,unsigned_long>
              (&msg,local_50,msg_00,(unsigned_long)params,in_R8);
    ::std::__cxx11::string::~string((string *)local_50);
    HandleCastError::AssignError(&msg,parameters);
    if (parameters->strict == false) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
      ::std::__cxx11::string::~string((string *)&msg);
      return false;
    }
    ::std::__cxx11::string::~string((string *)&msg);
  }
  pBVar3 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
    }
    pVVar4 = ArrayVector::GetEntry(source);
    pVVar5 = ArrayVector::GetEntry(result);
    msg._M_dataplus._M_p = (pointer)pBVar3[3]._vptr_BoundCastData;
    msg._M_string_length._0_1_ = parameters->strict;
    msg.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)&parameters->error_message;
    msg.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&parameters->error_message + 4);
    msg.field_2._8_4_ = *(undefined4 *)&(parameters->local_state).ptr;
    msg.field_2._12_4_ = *(undefined4 *)((long)&(parameters->local_state).ptr + 4);
  }
  else {
    Vector::Flatten(source,count);
    Vector::SetVectorType(result,FLAT_VECTOR);
    FlatVector::VerifyFlatVector(source);
    FlatVector::SetValidity(result,&source->validity);
    pVVar4 = ArrayVector::GetEntry(source);
    pVVar5 = ArrayVector::GetEntry(result);
    msg._M_dataplus._M_p = (pointer)pBVar3[3]._vptr_BoundCastData;
    msg._M_string_length._0_1_ = parameters->strict;
    msg.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)&parameters->error_message;
    msg.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&parameters->error_message + 4);
    msg.field_2._8_4_ = *(undefined4 *)&(parameters->local_state).ptr;
    msg.field_2._12_4_ = *(undefined4 *)((long)&(parameters->local_state).ptr + 4);
    msg_00 = (string *)((long)msg_00 * count);
  }
  uVar2 = (*(code *)pBVar3[1]._vptr_BoundCastData)(pVVar4,pVVar5,msg_00);
  return (bool)uVar2;
}

Assistant:

static bool ArrayToArrayCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {

	auto source_array_size = ArrayType::GetSize(source.GetType());
	auto target_array_size = ArrayType::GetSize(result.GetType());
	if (source_array_size != target_array_size) {
		// Cant cast between arrays of different sizes
		auto msg = StringUtil::Format("Cannot cast array of size %u to array of size %u", source_array_size,
		                              target_array_size);
		HandleCastError::AssignError(msg, parameters);
		if (!parameters.strict) {
			// if this was a TRY_CAST, we know every row will fail, so just return null
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return false;
		}
	}

	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();
	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		if (ConstantVector::IsNull(source)) {
			ConstantVector::SetNull(result, true);
		}

		auto &source_cc = ArrayVector::GetEntry(source);
		auto &result_cc = ArrayVector::GetEntry(result);

		// If the array vector is constant, the child vector must be flat (or constant if array size is 1)
		D_ASSERT(source_cc.GetVectorType() == VectorType::FLAT_VECTOR || source_array_size == 1);

		CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
		bool all_ok = cast_data.child_cast_info.function(source_cc, result_cc, source_array_size, child_parameters);
		return all_ok;
	} else {
		// Flatten if not constant
		source.Flatten(count);
		result.SetVectorType(VectorType::FLAT_VECTOR);

		FlatVector::SetValidity(result, FlatVector::Validity(source));
		auto &source_cc = ArrayVector::GetEntry(source);
		auto &result_cc = ArrayVector::GetEntry(result);

		CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
		bool all_ok =
		    cast_data.child_cast_info.function(source_cc, result_cc, count * source_array_size, child_parameters);
		return all_ok;
	}
}